

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsockets.c
# Opt level: O2

attr_list libcmsockets_LTX_non_blocking_listen
                    (CManager cm,CMtrans_services_conflict svc,transport_entry_conflict trans,
                    attr_list listen_info)

{
  undefined8 *puVar1;
  atom_t aVar2;
  int iVar3;
  int iVar4;
  uint __fd;
  __pid_t _Var5;
  ulong uVar6;
  time_t tVar7;
  void *pvVar8;
  attr_list p_Var9;
  char *pcVar10;
  ulong uVar11;
  undefined8 uVar12;
  CMtrans_services_conflict pCVar13;
  int iVar14;
  ulong uVar15;
  CManager p_Var16;
  ushort uVar17;
  size_t sStack_190;
  int use_hostname;
  int port_range_high;
  CMtrans_services_conflict local_178;
  sockaddr_in sock_addr;
  int IP;
  int port_range_low;
  int sock_opt_val;
  CManager local_150;
  int attr_port_num;
  uint length;
  transport_entry_conflict local_140;
  char host_name [256];
  
  puVar1 = (undefined8 *)trans->trans_data;
  attr_port_num = 0;
  use_hostname = 0;
  sock_opt_val = 1;
  if (((CManager)*puVar1 != (CManager)0x0) &&
     (iVar4 = (*svc->return_CM_lock_status)
                        ((CManager)*puVar1,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmsockets.c"
                         ,0x29e), iVar4 == 0)) {
    __assert_fail("CM_LOCKED(svc, sd->cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmsockets.c"
                  ,0x29e,
                  "attr_list libcmsockets_LTX_non_blocking_listen(CManager, CMtrans_services, transport_entry, attr_list)"
                 );
  }
  local_178 = svc;
  local_140 = trans;
  if (listen_info == (attr_list)0x0) {
    uVar11 = 0;
  }
  else {
    iVar4 = query_attr(listen_info,CM_IP_PORT,0,&attr_port_num);
    uVar11 = 0;
    if ((iVar4 != 0) && (uVar11 = (ulong)(uint)attr_port_num, 0xffff < (uint)attr_port_num)) {
      fprintf(_stderr,"Requested port number %d is invalid\n");
      return (attr_list)0x0;
    }
  }
  pCVar13 = local_178;
  uVar15 = 0;
  (*local_178->trace_out)(cm,"CMSocket begin listen, requested port %d");
  local_150 = cm;
  get_IP_config(host_name,0x100,&IP,&port_range_low,&port_range_high,&use_hostname,listen_info,
                pCVar13->trace_out,cm);
  p_Var16 = local_150;
  sock_addr.sin_family = 2;
  sock_addr.sin_addr.s_addr = 0;
  sock_addr.sin_port = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
  uVar6 = (ulong)*(uint *)(puVar1 + 2);
  if ((int)*(uint *)(puVar1 + 2) < 1) {
    uVar6 = uVar15;
  }
  __fd = 0;
  for (; uVar6 != uVar15; uVar15 = uVar15 + 1) {
    iVar4 = *(int *)(puVar1[4] + uVar15 * 4);
    if ((iVar4 == (int)(uVar11 & 0xffff)) ||
       ((port_range_low <= iVar4 && (iVar4 <= port_range_high)))) {
      __fd = *(uint *)(puVar1[3] + uVar15 * 4);
    }
  }
  if (__fd == 0) {
    __fd = socket(2,1,0);
    pCVar13 = local_178;
    if (__fd == 0xffffffff) {
      pcVar10 = "Cannot open INET socket\n";
    }
    else {
      if (sock_addr.sin_port == 0) {
        if (port_range_high == -1) {
          sock_addr.sin_port = 0;
          (*local_178->trace_out)(p_Var16,"CMSocket trying to bind to any available port");
          goto LAB_001031c2;
        }
        tVar7 = time((time_t *)0x0);
        _Var5 = getpid();
        iVar14 = port_range_high - port_range_low;
        srand((int)tVar7 + _Var5);
        iVar4 = -1;
        uVar11 = 0x1e;
        pCVar13 = local_178;
        while (iVar3 = port_range_low, p_Var16 = local_150, 0 < (int)uVar11) {
          iVar4 = rand();
          uVar17 = (short)(iVar4 % iVar14) + (short)iVar3;
          sock_addr.sin_port = uVar17 * 0x100 | uVar17 >> 8;
          (*pCVar13->trace_out)(local_150,"CMSocket trying to bind port %d");
          iVar4 = bind(__fd,(sockaddr *)&sock_addr,0x10);
          if (iVar4 == -1) {
            uVar11 = (ulong)((int)uVar11 - 1);
          }
          else {
            uVar11 = 0;
          }
          if ((int)(uVar11 % 5) == 4) {
            tVar7 = time((time_t *)0x0);
            _Var5 = getpid();
            pCVar13 = local_178;
            srand((int)tVar7 + _Var5);
          }
          if ((int)uVar11 == 0x14) {
            iVar14 = iVar14 * 10;
          }
          if ((int)uVar11 == 10) {
            iVar14 = iVar14 * 10;
          }
        }
      }
      else {
        iVar4 = setsockopt(__fd,1,2,&sock_opt_val,4);
        if (iVar4 != 0) {
          fwrite("Failed to set REUSEADDR on INET socket before bind\n",0x33,1,_stderr);
          pcVar10 = "setsockopt(SO_REUSEADDR) failed";
LAB_001033f4:
          perror(pcVar10);
          return (attr_list)0x0;
        }
        sock_opt_val = 1;
        iVar4 = setsockopt(__fd,1,0xf,&sock_opt_val,4);
        pCVar13 = local_178;
        if (iVar4 != 0) {
          fwrite("Failed to set REUSEADDR on INET socket before bind\n",0x33,1,_stderr);
          pcVar10 = "setsockopt(SO_REUSEPORT) failed";
          goto LAB_001033f4;
        }
        (*local_178->trace_out)(p_Var16,"CMSocket trying to bind selected port %d",uVar11 & 0xffff);
LAB_001031c2:
        iVar4 = bind(__fd,(sockaddr *)&sock_addr,0x10);
      }
      if (iVar4 != -1) {
        iVar4 = listen(__fd,0x400);
        if (iVar4 != 0) {
          pcVar10 = "listen failed\n";
          sStack_190 = 0xe;
          goto LAB_0010339e;
        }
        (*pCVar13->trace_out)
                  (p_Var16,"CMSockets Adding socket_accept_conn as action on fd %d",(ulong)__fd);
        (*pCVar13->fd_add_select)(p_Var16,__fd,socket_accept_conn,local_140,(void *)(long)(int)__fd)
        ;
        length = 0x10;
        iVar4 = getsockname(__fd,(sockaddr *)&sock_addr,&length);
        if (iVar4 < 0) goto LAB_00103361;
        pvVar8 = realloc((void *)puVar1[3],(long)*(int *)(puVar1 + 2) * 4 + 4);
        puVar1[3] = pvVar8;
        pvVar8 = realloc((void *)puVar1[4],(long)*(int *)(puVar1 + 2) * 4 + 4);
        puVar1[4] = pvVar8;
        *(uint *)(puVar1[3] + (long)*(int *)(puVar1 + 2) * 4) = __fd;
        uVar17 = sock_addr.sin_port << 8 | sock_addr.sin_port >> 8;
        iVar4 = *(int *)(puVar1 + 2);
        *(uint *)((long)pvVar8 + (long)iVar4 * 4) = (uint)uVar17;
        *(int *)(puVar1 + 2) = iVar4 + 1;
        goto LAB_00103284;
      }
      pcVar10 = "Cannot bind INET socket\n";
    }
    sStack_190 = 0x18;
LAB_0010339e:
    fwrite(pcVar10,sStack_190,1,_stderr);
    return (attr_list)0x0;
  }
  length = 0x10;
  iVar4 = getsockname(__fd,(sockaddr *)&sock_addr,&length);
  pCVar13 = local_178;
  if (iVar4 < 0) {
LAB_00103361:
    pcVar10 = "Cannot get socket name\n";
    sStack_190 = 0x17;
    goto LAB_0010339e;
  }
  (*local_178->trace_out)
            (p_Var16,"CMSockets reusing prior listen, fd %d, port %d\n",(ulong)__fd,
             (ulong)(ushort)(sock_addr.sin_port << 8 | sock_addr.sin_port >> 8));
  uVar17 = sock_addr.sin_port << 8 | sock_addr.sin_port >> 8;
LAB_00103284:
  (*pCVar13->trace_out)
            (p_Var16,"CMSocket listen succeeded on port %d, fd %d",(ulong)uVar17,(ulong)__fd);
  p_Var9 = (attr_list)create_attr_list();
  if ((void *)puVar1[1] != (void *)0x0) {
    (*pCVar13->free_func)((void *)puVar1[1]);
  }
  pcVar10 = strdup(host_name);
  puVar1[1] = pcVar10;
  if (use_hostname == 0 && IP != 0) {
    add_attr(p_Var9,CM_IP_ADDR,1);
  }
  iVar4 = use_hostname;
  pcVar10 = getenv("CMSocketsUseHostname");
  aVar2 = CM_IP_HOSTNAME;
  if ((pcVar10 == (char *)0x0) && (iVar4 == 0)) {
    if (IP != 0) goto LAB_00103337;
    uVar12 = 1;
    pcVar10 = (char *)0x7f000001;
    aVar2 = CM_IP_ADDR;
  }
  else {
    pcVar10 = strdup(host_name);
    uVar12 = 3;
  }
  add_attr(p_Var9,aVar2,uVar12,pcVar10);
LAB_00103337:
  add_attr(p_Var9,CM_IP_PORT,1,uVar17);
  return p_Var9;
}

Assistant:

extern attr_list
libcmsockets_LTX_non_blocking_listen(CManager cm, CMtrans_services svc, transport_entry trans, attr_list listen_info)
{
    socket_client_data_ptr sd = trans->trans_data;
    unsigned int length;
    struct sockaddr_in sock_addr;
    int sock_opt_val = 1;
    SOCKET conn_sock = 0;
    int attr_port_num = 0;
    u_short port_num = 0;
    int port_range_low, port_range_high;
    int use_hostname = 0;
    int IP;
    char host_name[256];

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    /* 
     *  Check to see if a bind to a specific port was requested
     */
    if (listen_info != NULL
	&& !query_attr(listen_info, CM_IP_PORT,
		       NULL, (attr_value *)(intptr_t) & attr_port_num)) {
	port_num = 0;
    } else {
	if (attr_port_num > USHRT_MAX || attr_port_num < 0) {
	    fprintf(stderr, "Requested port number %d is invalid\n", attr_port_num);
	    return NULL;
	}
	port_num = attr_port_num;
    }

    svc->trace_out(cm, "CMSocket begin listen, requested port %d", attr_port_num);
    get_IP_config(host_name, sizeof(host_name), &IP, &port_range_low, &port_range_high, 
		  &use_hostname, listen_info, svc->trace_out, (void *)cm);

    sock_addr.sin_family = AF_INET;
    sock_addr.sin_addr.s_addr = INADDR_ANY;
    sock_addr.sin_port = htons(port_num);

    for (int i = 0; i < sd->listen_count; i++) {
	if ((sd->listen_ports[i] == port_num) ||
	    ((sd->listen_ports[i] >= port_range_low) &&
	     (sd->listen_ports[i] <= port_range_high))) {
	    conn_sock = sd->listen_fds[i];
	}
    }
    if (!conn_sock) {
	conn_sock = socket(AF_INET, SOCK_STREAM, 0);
	if (conn_sock == SOCKET_ERROR) {
	    fprintf(stderr, "Cannot open INET socket\n");
	    return NULL;
	}
	if (sock_addr.sin_port != 0) {
	    /* specific port requested. set REUSEADDR, REUSEPORT because previous server might have died badly */
	    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEADDR, (char *) &sock_opt_val,
			   sizeof(sock_opt_val)) != 0) {
		fprintf(stderr, "Failed to set REUSEADDR on INET socket before bind\n");
		perror("setsockopt(SO_REUSEADDR) failed");
		return NULL;
	    }
#ifdef SO_REUSEPORT
	    sock_opt_val = 1;
	    if (setsockopt(conn_sock, SOL_SOCKET, SO_REUSEPORT, (const char*)&sock_opt_val, sizeof(sock_opt_val)) != 0) {
		fprintf(stderr, "Failed to set REUSEADDR on INET socket before bind\n");
		perror("setsockopt(SO_REUSEPORT) failed");
		return NULL;
	    }
#endif
	    svc->trace_out(cm, "CMSocket trying to bind selected port %d", port_num);
	    if (bind(conn_sock, (struct sockaddr *) &sock_addr,
		     sizeof sock_addr) == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	} else if (port_range_high == -1) {
	    /* bind to any port, range unconstrained */
	    sock_addr.sin_port = 0;
	    svc->trace_out(cm, "CMSocket trying to bind to any available port");
	    if (bind(conn_sock, (struct sockaddr *) &sock_addr,
		     sizeof sock_addr) == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	} else {
	    long seedval = (long) time(NULL) + getpid();
	    /* port num is free.  Constrain to range to standards */
	    int size = port_range_high - port_range_low;
	    int tries = 30;
	    int result = SOCKET_ERROR;
	    srand(seedval);
	    while (tries > 0) {
		int target = port_range_low + (rand() % size);
		sock_addr.sin_port = htons(target);
		svc->trace_out(cm, "CMSocket trying to bind port %d", target);
		result = bind(conn_sock, (struct sockaddr *) &sock_addr,
			      sizeof sock_addr);
		tries--;
		if (result != SOCKET_ERROR) tries = 0;
		if (tries%5 == 4) {
		    /* try reseeding in case we're in sync with another process */
		    srand((int)time(NULL) + (int)getpid());
		}
		if (tries == 20) {
		    /* damn, tried a lot, increase the range (This might violate specified range) */
		    size *= 10;
		}
		if (tries == 10) {
		    /* damn, tried a lot more, increase the range (This might violate specified range) */
		    size *= 10;
		}
	    }
	    if (result == SOCKET_ERROR) {
		fprintf(stderr, "Cannot bind INET socket\n");
		return NULL;
	    }
	}
	/* begin listening for conns and set the backlog */
	if (listen(conn_sock, FD_SETSIZE)) {
	    fprintf(stderr, "listen failed\n");
	    return NULL;
	}
	svc->trace_out(cm, "CMSockets Adding socket_accept_conn as action on fd %d", conn_sock);
	svc->fd_add_select(cm, conn_sock, (select_list_func)socket_accept_conn,
			   (void *) trans, (void *) (intptr_t)conn_sock);

	length = sizeof(sock_addr);
	if (getsockname(conn_sock, (struct sockaddr *) &sock_addr, &length) < 0) {
	    fprintf(stderr, "Cannot get socket name\n");
	    return NULL;
	}
	sd->listen_fds = realloc(sd->listen_fds,
				 sizeof(SOCKET)*(sd->listen_count+1));
	sd->listen_ports = realloc(sd->listen_ports,
				 sizeof(int)*(sd->listen_count+1));
	sd->listen_fds[sd->listen_count] = conn_sock;
	sd->listen_ports[sd->listen_count] = ntohs(sock_addr.sin_port);
	sd->listen_count++;
    } else {
	length = sizeof(sock_addr);
	if (getsockname(conn_sock, (struct sockaddr *) &sock_addr, &length) < 0) {
	    fprintf(stderr, "Cannot get socket name\n");
	    return NULL;
	}
	svc->trace_out(cm, "CMSockets reusing prior listen, fd %d, port %d\n", conn_sock, ntohs(sock_addr.sin_port));
    }
    /* set the port num as one we can be contacted at */
    {
	int int_port_num = ntohs(sock_addr.sin_port);
	attr_list ret_list;

	svc->trace_out(cm, "CMSocket listen succeeded on port %d, fd %d",
		       int_port_num, conn_sock);
	ret_list = create_attr_list();

	if (sd->hostname != NULL)
	    svc->free_func(sd->hostname);
	sd->hostname = strdup(host_name);
	if ((IP != 0) && (!use_hostname)) {
	    add_attr(ret_list, CM_IP_ADDR, Attr_Int4,
		     (attr_value) (intptr_t)IP);
	}
	if ((getenv("CMSocketsUseHostname") != NULL) || 
	    use_hostname) {
	    add_attr(ret_list, CM_IP_HOSTNAME, Attr_String,
		     (attr_value) strdup(host_name));
	} else if (IP == 0) {
	    add_attr(ret_list, CM_IP_ADDR, Attr_Int4, 
		     (attr_value)INADDR_LOOPBACK);
	}
	add_attr(ret_list, CM_IP_PORT, Attr_Int4,
		 (attr_value) (intptr_t)int_port_num);

	return ret_list;
    }
}